

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ConditionalStatementSyntax::setChild
          (ConditionalStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  StatementSyntax *pSVar6;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  NamedLabelSyntax *pNVar10;
  ElseClauseSyntax *pEVar11;
  logic_error *this_00;
  long *plVar12;
  char *pcVar13;
  size_type *psVar14;
  long *plVar15;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (8 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar12;
    psVar14 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar14) {
      local_b0.field_2._M_allocated_capacity = *psVar14;
      local_b0.field_2._8_8_ = plVar12[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar14;
    }
    local_b0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::to_string(&local_70,0xafb);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar12;
    plVar15 = plVar12 + 2;
    if (local_90 == plVar15) {
      local_80 = *plVar15;
      lStack_78 = plVar12[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar15;
    }
    local_88 = plVar12[1];
    *plVar12 = (long)plVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar12;
    plVar15 = plVar12 + 2;
    if (local_f0 == plVar15) {
      local_e0 = *plVar15;
      lStack_d8 = plVar12[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar15;
    }
    local_e8 = plVar12[1];
    *plVar12 = (long)plVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar10 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar10 = (NamedLabelSyntax *)*ppSVar9;
      if ((pNVar10->super_SyntaxNode).kind != NamedLabel) {
        pcVar13 = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]";
LAB_002ae833:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,pcVar13);
      }
    }
    (this->super_StatementSyntax).label = pNVar10;
    break;
  case 1:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar9);
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar7->super_SyntaxListBase).childCount;
    sVar2 = (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar2;
    break;
  case 2:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->uniqueOrPriority).kind = pvVar8->kind;
    (this->uniqueOrPriority).field_0x2 = uVar3;
    (this->uniqueOrPriority).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->uniqueOrPriority).rawLen = uVar5;
    (this->uniqueOrPriority).info = pIVar1;
    break;
  case 3:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->ifKeyword).kind = pvVar8->kind;
    (this->ifKeyword).field_0x2 = uVar3;
    (this->ifKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->ifKeyword).rawLen = uVar5;
    (this->ifKeyword).info = pIVar1;
    break;
  case 4:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->openParen).kind = pvVar8->kind;
    (this->openParen).field_0x2 = uVar3;
    (this->openParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->openParen).rawLen = uVar5;
    (this->openParen).info = pIVar1;
    break;
  case 5:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pcVar13 = 
      "slang::not_null<slang::syntax::ConditionalPredicateSyntax *>::not_null(U &&) [T = slang::syntax::ConditionalPredicateSyntax *, U = slang::syntax::ConditionalPredicateSyntax *]"
      ;
LAB_002ae814:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,pcVar13);
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if ((((ConditionalPredicateSyntax *)*ppSVar9)->super_SyntaxNode).kind != ConditionalPredicate) {
      pcVar13 = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ConditionalPredicateSyntax]"
      ;
      goto LAB_002ae833;
    }
    (this->predicate).ptr = (ConditionalPredicateSyntax *)*ppSVar9;
    break;
  case 6:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->closeParen).kind = pvVar8->kind;
    (this->closeParen).field_0x2 = uVar3;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->closeParen).rawLen = uVar5;
    (this->closeParen).info = pIVar1;
    break;
  case 7:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pcVar13 = 
      "slang::not_null<slang::syntax::StatementSyntax *>::not_null(U &&) [T = slang::syntax::StatementSyntax *, U = slang::syntax::StatementSyntax *]"
      ;
      goto LAB_002ae814;
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::StatementSyntax>(*ppSVar9);
    (this->statement).ptr = pSVar6;
    break;
  case 8:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar11 = (ElseClauseSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar11 = (ElseClauseSyntax *)*ppSVar9;
      if ((pEVar11->super_SyntaxNode).kind != ElseClause) {
        pcVar13 = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ElseClauseSyntax]";
        goto LAB_002ae833;
      }
    }
    this->elseClause = pEVar11;
  }
  return;
}

Assistant:

void ConditionalStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: uniqueOrPriority = child.token(); return;
        case 3: ifKeyword = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: predicate = child.node() ? &child.node()->as<ConditionalPredicateSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        case 8: elseClause = child.node() ? &child.node()->as<ElseClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}